

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O1

void worker_free(worker_handle *wh)

{
  condvar_handle *condvar;
  
  condvar = (condvar_handle *)wh->priv;
  if (condvar != (condvar_handle *)0x0) {
    worker_join(wh);
    thread_free((thread_handle *)(condvar + 3));
    mutex_free((mutex_handle *)(condvar + 2));
    condvar_free(condvar + 1);
    condvar_free(condvar);
    free(wh->priv);
    wh->priv = (void *)0x0;
  }
  return;
}

Assistant:

void worker_free(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;

	if (wh->priv != NULL) {
		worker_join(wh);

		thread_free(&priv->thread);
		mutex_free(&priv->mutex);
		condvar_free(&priv->condvar_idle);
		condvar_free(&priv->condvar);

		free(wh->priv);
		wh->priv = NULL;
	}
}